

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O1

bool __thiscall cmDebugger_impl::ClearWatchpoint(cmDebugger_impl *this,watchpoint_id id)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  bool bVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
  pVar9;
  ulong local_38;
  
  local_38 = id;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->breakpointMutex);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  p_Var1 = &(this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < local_38]) {
    if (*(ulong *)(p_Var6 + 1) >= local_38) {
      p_Var7 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var7 != p_Var1) && (p_Var6 = p_Var7, local_38 < *(ulong *)(p_Var7 + 1)))
  {
    p_Var6 = &p_Var1->_M_header;
  }
  sVar3 = (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    p_Var7 = p_Var6[1]._M_left;
    if (p_Var7 != (_Base_ptr)0x0) {
      iVar5 = *(int *)&p_Var7->_M_parent;
      do {
        if (iVar5 == 0) {
          p_Var7 = (_Base_ptr)0x0;
          break;
        }
        LOCK();
        iVar2 = *(int *)&p_Var7->_M_parent;
        bVar8 = iVar5 == iVar2;
        if (bVar8) {
          *(int *)&p_Var7->_M_parent = iVar5 + 1;
          iVar2 = iVar5;
        }
        iVar5 = iVar2;
        UNLOCK();
      } while (!bVar8);
    }
    if (p_Var7 == (_Base_ptr)0x0) {
      bVar8 = true;
    }
    else {
      bVar8 = *(int *)&p_Var7->_M_parent == 0;
    }
    if ((!bVar8) && (p_Var6 = p_Var6[1]._M_parent, p_Var6 != (_Base_ptr)0x0)) {
      cmVariableWatch::RemoveWatch
                (this->CMakeInstance->VariableWatch,(string *)&p_Var6->_M_left,WatchMethodCB,
                 p_Var6[1]._M_right);
      pVar9 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
              ::equal_range(&(this->activeWatchpoints)._M_t,&local_38);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<cmDebugger_impl::Watchpoint>_>_>_>
      ::_M_erase_aux(&(this->activeWatchpoints)._M_t,(_Base_ptr)pVar9.first._M_node,
                     (_Base_ptr)pVar9.second._M_node);
    }
    if (p_Var7 != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7);
    }
  }
  sVar4 = (this->activeWatchpoints)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointMutex);
  return sVar3 != sVar4;
}

Assistant:

bool ClearWatchpoint(watchpoint_id id) override
  {
    std::lock_guard<std::mutex> l(breakpointMutex);
    auto watchpointIt = activeWatchpoints.find(id);
    auto originalSize = activeWatchpoints.size();
    if (watchpointIt != activeWatchpoints.end()) {
      if (auto watchpoint = watchpointIt->second.lock()) {
        this->CMakeInstance.GetVariableWatch()->RemoveWatch(
          watchpoint->Variable, WatchMethodCB, watchpoint->user_data);
        activeWatchpoints.erase(id);
      }
    }

    return originalSize != activeWatchpoints.size();
  }